

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O2

void __thiscall jpge::jpeg_encoder::put_bits(jpeg_encoder *this,uint bits,uint len)

{
  uint *puVar1;
  uint8 *puVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = len + this->m_bits_in;
  this->m_bits_in = uVar3;
  uVar4 = bits << (0x18U - (char)uVar3 & 0x1f) | this->m_bit_buffer;
  this->m_bit_buffer = uVar4;
  while (7 < uVar3) {
    puVar2 = this->m_pOut_buf;
    this->m_pOut_buf = puVar2 + 1;
    *puVar2 = (uint8)(uVar4 >> 0x10);
    puVar1 = &this->m_out_buf_left;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      flush_output_buffer(this);
    }
    if ((~uVar4 & 0xff0000) == 0) {
      puVar2 = this->m_pOut_buf;
      this->m_pOut_buf = puVar2 + 1;
      *puVar2 = '\0';
      puVar1 = &this->m_out_buf_left;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        flush_output_buffer(this);
      }
    }
    uVar4 = this->m_bit_buffer << 8;
    this->m_bit_buffer = uVar4;
    uVar3 = this->m_bits_in - 8;
    this->m_bits_in = uVar3;
  }
  return;
}

Assistant:

void jpeg_encoder::put_bits(uint bits, uint len)
	{
		m_bit_buffer |= ((uint32)bits << (24 - (m_bits_in += len)));
		while (m_bits_in >= 8)
		{
			uint8 c;
#define JPGE_PUT_BYTE(c) { *m_pOut_buf++ = (c); if (--m_out_buf_left == 0) flush_output_buffer(); }
			JPGE_PUT_BYTE(c = (uint8)((m_bit_buffer >> 16) & 0xFF));
			if (c == 0xFF) JPGE_PUT_BYTE(0);
			m_bit_buffer <<= 8;
			m_bits_in -= 8;
		}
	}